

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

void jit_profile_callback(lua_State *L2,lua_State *L,int samples,int vmstate)

{
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *paVar1;
  undefined4 *puVar2;
  double *pdVar3;
  int iVar4;
  cTValue *pcVar5;
  lua_State *L_00;
  ulong uVar6;
  int in_EDX;
  cTValue *in_RSI;
  GCtab *in_RDI;
  int status;
  char vmst;
  cTValue *tv;
  TValue key;
  lua_State *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  
  pcVar5 = lj_tab_get(in_stack_fffffffffffffeb8,in_RDI,in_RSI);
  if ((pcVar5->field_2).it == 0xfffffff7) {
    paVar1 = *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 **)&in_RDI->asize
    ;
    *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 **)&in_RDI->asize =
         paVar1 + 2;
    *paVar1 = (pcVar5->field_2).field_0;
    paVar1[1].i = -9;
    puVar2 = *(undefined4 **)&in_RDI->asize;
    *(undefined4 **)&in_RDI->asize = puVar2 + 2;
    *puVar2 = (int)in_RSI;
    puVar2[1] = 0xfffffff9;
    pdVar3 = *(double **)&in_RDI->asize;
    *(double **)&in_RDI->asize = pdVar3 + 1;
    *pdVar3 = (double)in_EDX;
    puVar2 = *(undefined4 **)&in_RDI->asize;
    *(undefined4 **)&in_RDI->asize = puVar2 + 2;
    L_00 = (lua_State *)
           lj_str_new((lua_State *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    *puVar2 = (int)L_00;
    puVar2[1] = 0xfffffffb;
    iVar4 = lua_pcall(L_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20));
    if (iVar4 != 0) {
      if (*(long *)((ulong)(in_RDI->array).ptr32 + 0x178) != 0) {
        (**(code **)((ulong)(in_RDI->array).ptr32 + 0x178))(in_RDI);
      }
      exit(1);
    }
    uVar6 = (ulong)(in_RDI->array).ptr32;
    *(uint *)(uVar6 + 0x31c) = *(uint *)(uVar6 + 0x31c) & 0xffffffef;
  }
  return;
}

Assistant:

static void jit_profile_callback(lua_State *L2, lua_State *L, int samples,
				 int vmstate)
{
  TValue key;
  cTValue *tv;
  key.u64 = KEY_PROFILE_FUNC;
  tv = lj_tab_get(L, tabV(registry(L)), &key);
  if (tvisfunc(tv)) {
    char vmst = (char)vmstate;
    int status;
    setfuncV(L2, L2->top++, funcV(tv));
    setthreadV(L2, L2->top++, L);
    setintV(L2->top++, samples);
    setstrV(L2, L2->top++, lj_str_new(L2, &vmst, 1));
    status = lua_pcall(L2, 3, 0, 0);  /* callback(thread, samples, vmstate) */
    if (status) {
      if (G(L2)->panic) G(L2)->panic(L2);
      exit(EXIT_FAILURE);
    }
    lj_trace_abort(G(L2));
  }
}